

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_json.hpp
# Opt level: O3

type __thiscall
jsoncons::
decode_json<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (jsoncons *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last,basic_json_decode_options<char> *options)

{
  value_type *__val;
  system_error *this_00;
  undefined8 extraout_RDX;
  pointer pcVar1;
  type tVar2;
  error_code __ec;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  decoder;
  basic_json_reader<char,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<char>_>
  reader;
  allocator<char> local_239;
  iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  local_200;
  error_code local_180;
  basic_json_reader<char,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<char>_>
  local_170;
  
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::json_decoder(&local_200,(allocator_type *)&local_170,(temp_allocator_type *)&local_238);
  local_238.position_ = 0;
  local_238.current_._M_current = first._M_current;
  local_238.end_._M_current = last._M_current;
  local_238.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x4000);
  pcVar1 = local_238.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start + 0x4000;
  local_238.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pcVar1;
  memset(local_238.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start,0,0x4000);
  local_238.buffer_length_ = 0;
  local_238.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcVar1;
  basic_json_reader<char,jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::allocator<char>>
  ::
  basic_json_reader<jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
            ((basic_json_reader<char,jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::allocator<char>>
              *)&local_170,&local_238,&local_200.super_basic_json_visitor<char>,options,&local_239);
  if (local_238.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  basic_json_reader<char,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<char>_>
  ::read_next(&local_170);
  basic_json_reader<char,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<char>_>
  ::check_done(&local_170);
  if (local_200.is_valid_ != false) {
    json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
    ::get_result((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                  *)this);
    basic_json_parser<char,_std::allocator<char>_>::~basic_json_parser(&local_170.parser_);
    if (local_170.source_.source_.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_170.source_.source_.buffer_.
                      super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_170.source_.source_.buffer_.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_170.source_.source_.buffer_.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_200.structure_stack_.
        super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_200.structure_stack_.
                      super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_200.structure_stack_.
                            super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_200.structure_stack_.
                            super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::~vector(&local_200.item_stack_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.name_._M_dataplus._M_p != &local_200.name_.field_2) {
      operator_delete(local_200.name_._M_dataplus._M_p,
                      local_200.name_.field_2._M_allocated_capacity + 1);
    }
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_200.result_);
    tVar2.field_0.int64_.val_ = extraout_RDX;
    tVar2.field_0._0_8_ = this;
    return (type)tVar2.field_0;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x58);
  std::error_code::error_code<jsoncons::conv_errc,void>(&local_180,conversion_failed);
  __ec._4_4_ = 0;
  __ec._M_value = local_180._M_value;
  *(undefined ***)(this_00 + 0x50) = &PTR__json_exception_00b2f248;
  __ec._M_cat = local_180._M_cat;
  std::system_error::system_error(this_00,__ec);
  *(undefined8 *)this_00 = 0xb2f1e8;
  *(undefined8 *)(this_00 + 0x50) = 0xb2f220;
  *(size_t *)(this_00 + 0x20) = local_170.parser_.line_;
  *(size_t *)(this_00 + 0x28) = (local_170.parser_.position_ - local_170.parser_.mark_position_) + 1
  ;
  *(system_error **)(this_00 + 0x30) = this_00 + 0x40;
  *(undefined8 *)(this_00 + 0x38) = 0;
  this_00[0x40] = (system_error)0x0;
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value,T>::type
    decode_json(InputIt first, InputIt last,
                const basic_json_decode_options<typename std::iterator_traits<InputIt>::value_type>& options = 
                    basic_json_decode_options<typename std::iterator_traits<InputIt>::value_type>())
    {
        using char_type = typename std::iterator_traits<InputIt>::value_type;

        jsoncons::json_decoder<T> decoder;
        basic_json_reader<char_type, iterator_source<InputIt>> reader(iterator_source<InputIt>(first,last), decoder, options);
        reader.read();
        if (!decoder.is_valid())
        {
            JSONCONS_THROW(ser_error(conv_errc::conversion_failed, reader.line(), reader.column()));
        }
        return decoder.get_result();
    }